

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbPush.c
# Opt level: O1

int Acb_ObjPushToFanins(Acb_Ntk_t *p,int iObj,int nLutSize)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  Vec_Int_t *pVVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  byte bVar9;
  byte bVar10;
  long lVar11;
  word *pwVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  word *pwVar20;
  
  if (iObj < 1) {
    __assert_fail("i>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                  ,0xfe,"int Acb_ObjFanOffset(Acb_Ntk_t *, int)");
  }
  iVar1 = (p->vObjFans).nSize;
  if (iVar1 <= iObj) goto LAB_003aa954;
  piVar3 = (p->vObjFans).pArray;
  lVar11 = (long)piVar3[(uint)iObj];
  if ((lVar11 < 0) || (iVar2 = (p->vFanSto).nSize, iVar2 <= piVar3[(uint)iObj])) {
LAB_003aa935:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
  }
  piVar4 = (p->vFanSto).pArray;
  uVar17 = (ulong)piVar4[lVar11];
  iVar7 = 0;
  if (1 < (long)uVar17) {
    uVar8 = 0;
    do {
      iVar7 = piVar4[lVar11 + uVar8 + 1];
      lVar15 = (long)iVar7;
      if (lVar15 < 1) goto LAB_003aa89a;
      if ((p->vObjType).nSize <= iVar7) goto LAB_003aa8b9;
      if ((p->vObjType).pArray[lVar15] != '\x03') {
        if ((p->vFanouts).nSize <= iVar7) goto LAB_003aa916;
        if ((p->vFanouts).pArray[lVar15].nSize < 2) {
          if (iVar1 <= iVar7) goto LAB_003aa954;
          iVar6 = piVar3[lVar15];
          if (((long)iVar6 < 0) || (iVar2 <= iVar6)) goto LAB_003aa935;
          if (piVar4[iVar6] != nLutSize) {
            pwVar20 = s_Truths6;
            pwVar12 = s_Truths6Neg;
            uVar16 = 0;
            do {
              if (uVar8 != uVar16) {
                iVar6 = (p->vObjTruth).nSize;
                if (iVar6 < 1) goto LAB_003aa8d8;
                if (iVar6 <= iObj) goto LAB_003aa8f7;
                if ((5 < uVar16) || (5 < uVar8)) {
                  __assert_fail("iVar >= 0 && iVar < 6",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                                ,0x337,"word Abc_Tt6Cofactor0(word, int)");
                }
                uVar19 = (p->vObjTruth).pArray[(uint)iObj];
                uVar13 = *pwVar20 & uVar19;
                bVar9 = (byte)(1 << ((byte)uVar16 & 0x1f));
                uVar19 = uVar19 & *pwVar12;
                uVar19 = uVar19 << (bVar9 & 0x3f) | uVar19;
                uVar18 = uVar19 & s_Truths6Neg[uVar8];
                bVar10 = (byte)(1 << ((byte)uVar8 & 0x1f));
                uVar13 = uVar13 >> (bVar9 & 0x3f) | uVar13;
                uVar19 = uVar19 & s_Truths6[uVar8];
                uVar18 = uVar18 << (bVar10 & 0x3f) | uVar18;
                uVar19 = uVar19 >> (bVar10 & 0x3f) | uVar19;
                uVar14 = s_Truths6Neg[uVar8] & uVar13;
                uVar14 = uVar14 << (bVar10 & 0x3f) | uVar14;
                uVar13 = uVar13 & s_Truths6[uVar8];
                if (((uVar18 == uVar19) && (uVar18 == uVar14)) ||
                   ((uVar13 = uVar13 >> (bVar10 & 0x3f) | uVar13, uVar13 == uVar18 &&
                    (uVar13 == uVar14)))) goto LAB_003aa6e5;
                if ((uVar13 == uVar19 && (uVar13 == uVar14 || uVar13 == uVar18)) ||
                   (uVar13 == uVar18 && uVar19 == uVar14)) goto LAB_003aa6e5;
              }
              uVar16 = uVar16 + 1;
              pwVar12 = pwVar12 + 1;
              pwVar20 = pwVar20 + 1;
            } while (uVar17 != uVar16);
            uVar16 = 0xffffffff;
LAB_003aa6e5:
            if ((int)uVar16 != -1) {
              Acb_ObjPushToFanin(p,iObj,(int)uVar16,iVar7);
              goto LAB_003aa867;
            }
          }
        }
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar17);
    iVar6 = 0;
    iVar7 = 0;
    if (piVar4[lVar11] == 2) {
      if ((p->vFanouts).nSize <= iObj) {
LAB_003aa916:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      pVVar5 = (p->vFanouts).pArray;
      iVar7 = iVar6;
      if (pVVar5[(uint)iObj].nSize == 1) {
        if (pVVar5[(uint)iObj].nSize < 1) {
LAB_003aa954:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar6 = *pVVar5[(uint)iObj].pArray;
        lVar11 = (long)iVar6;
        if (lVar11 < 1) {
LAB_003aa89a:
          __assert_fail("i>0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                        ,0xee,"Acb_ObjType_t Acb_ObjType(Acb_Ntk_t *, int)");
        }
        if ((p->vObjType).nSize <= iVar6) {
LAB_003aa8b9:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                        ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
        }
        if ((p->vObjType).pArray[lVar11] != '\x04') {
          if (iVar1 <= iVar6) goto LAB_003aa954;
          iVar1 = piVar3[lVar11];
          if (((long)iVar1 < 0) || (iVar2 <= iVar1)) goto LAB_003aa935;
          if (piVar4[iVar1] < nLutSize) {
            iVar1 = (p->vObjTruth).nSize;
            if (iVar1 < 1) {
LAB_003aa8d8:
              __assert_fail("Acb_NtkHasObjTruths(p)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                            ,0x10b,"word Acb_ObjTruth(Acb_Ntk_t *, int)");
            }
            if (iVar1 <= iObj) {
LAB_003aa8f7:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                            ,0x1ad,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
            }
            uVar17 = (p->vObjTruth).pArray[(uint)iObj];
            lVar15 = 0;
            lVar11 = 0;
            do {
              uVar8 = *(ulong *)((long)s_Truths6Neg + lVar15) & uVar17;
              bVar10 = (byte)(1 << ((byte)lVar11 & 0x1f));
              uVar16 = *(ulong *)((long)s_Truths6 + lVar15) & uVar17;
              uVar8 = uVar8 << (bVar10 & 0x3f) | uVar8;
              uVar16 = uVar16 >> (bVar10 & 0x3f) | uVar16;
              if (uVar8 == uVar16) {
                __assert_fail("c0 != c1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                              ,0xa7f,"int Abc_Tt6CheckOutDec(word, int, word *)");
              }
              if ((((uVar16 ^ uVar8) == 0xffffffffffffffff) || (uVar8 + 1 < 2)) || (uVar16 + 1 < 2))
              goto LAB_003aa84f;
              lVar11 = lVar11 + 1;
              lVar15 = lVar15 + 8;
            } while (lVar11 != 2);
            lVar11 = 0xffffffff;
LAB_003aa84f:
            Acb_ObjPushToFanout(p,iObj,(int)lVar11,iVar6);
LAB_003aa867:
            iVar7 = 1;
          }
        }
      }
    }
  }
  return iVar7;
}

Assistant:

int Acb_ObjPushToFanins( Acb_Ntk_t * p, int iObj, int nLutSize )
{
    int k, k2, iFanin, * pFanins;
    if ( Acb_ObjFaninNum(p, iObj) < 2 )
        return 0;
    Acb_ObjForEachFaninFast( p, iObj, pFanins, iFanin, k )
    {
        if ( Acb_ObjIsCi(p, iFanin) )
            continue;
        if ( Acb_ObjFanoutNum(p, iFanin) > 1 )
            continue;
        if ( Acb_ObjFaninNum(p, iFanin) == nLutSize )
            continue;
        if ( (k2 = Acb_ObjFindFaninPushableIndex(p, iObj, k)) == -1 )
            continue;
        //printf( "Object %4d : Pushing fanin %d (%d) into fanin %d.\n", iObj, Acb_ObjFanin(p, iObj, k2), k2, iFanin );
        Acb_ObjPushToFanin( p, iObj, k2, iFanin );
        return 1;
    }
    if ( Acb_ObjFaninNum(p, iObj) == 2 && Acb_ObjFanoutNum(p, iObj) == 1 )
    {
        int iFanout = Acb_ObjFanout( p, iObj, 0 );
        if ( !Acb_ObjIsCo(p, iFanout) && Acb_ObjFaninNum(p, iFanout) < nLutSize )
        {
            k2 = Acb_ObjFindFanoutPushableIndex( p, iObj );
            //printf( "Object %4d : Pushing fanin %d (%d) into fanout %d.\n", iObj, Acb_ObjFanin(p, iObj, k2), k2, iFanout );
            Acb_ObjPushToFanout( p, iObj, k2, iFanout );
            return 1;
        }
    }
    return 0;
}